

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

_Bool http_should_fail(Curl_easy *data,int httpcode)

{
  int httpcode_local;
  Curl_easy *data_local;
  
  if ((*(ulong *)&(data->set).field_0x8ca >> 0x13 & 1) == 0) {
    data_local._7_1_ = false;
  }
  else if (httpcode < 400) {
    data_local._7_1_ = false;
  }
  else if ((((data->state).resume_from == 0) || ((data->state).httpreq != '\0')) ||
          (httpcode != 0x1a0)) {
    if ((httpcode == 0x191) || (httpcode == 0x197)) {
      if ((httpcode == 0x191) && ((data->state).aptr.user == (char *)0x0)) {
        data_local._7_1_ = true;
      }
      else if ((httpcode == 0x197) && (((ulong)data->conn->bits >> 2 & 1) == 0)) {
        data_local._7_1_ = true;
      }
      else {
        data_local._7_1_ = (*(uint *)&(data->state).field_0x774 >> 5 & 1) != 0;
      }
    }
    else {
      data_local._7_1_ = true;
    }
  }
  else {
    data_local._7_1_ = false;
  }
  return data_local._7_1_;
}

Assistant:

static bool http_should_fail(struct Curl_easy *data, int httpcode)
{
  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);

  /*
  ** If we have not been asked to fail on error,
  ** do not fail.
  */
  if(!data->set.http_fail_on_error)
    return FALSE;

  /*
  ** Any code < 400 is never terminal.
  */
  if(httpcode < 400)
    return FALSE;

  /*
  ** A 416 response to a resume request is presumably because the file is
  ** already completely downloaded and thus not actually a fail.
  */
  if(data->state.resume_from && data->state.httpreq == HTTPREQ_GET &&
     httpcode == 416)
    return FALSE;

  /*
  ** Any code >= 400 that is not 401 or 407 is always
  ** a terminal error
  */
  if((httpcode != 401) && (httpcode != 407))
    return TRUE;

  /*
  ** All we have left to deal with is 401 and 407
  */
  DEBUGASSERT((httpcode == 401) || (httpcode == 407));

  /*
  ** Examine the current authentication state to see if this is an error. The
  ** idea is for this function to get called after processing all the headers
  ** in a response message. So, if we have been to asked to authenticate a
  ** particular stage, and we have done it, we are OK. If we are already
  ** completely authenticated, it is not OK to get another 401 or 407.
  **
  ** It is possible for authentication to go stale such that the client needs
  ** to reauthenticate. Once that info is available, use it here.
  */

  /*
  ** Either we are not authenticating, or we are supposed to be authenticating
  ** something else. This is an error.
  */
  if((httpcode == 401) && !data->state.aptr.user)
    return TRUE;
#ifndef CURL_DISABLE_PROXY
  if((httpcode == 407) && !data->conn->bits.proxy_user_passwd)
    return TRUE;
#endif

  return data->state.authproblem;
}